

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O3

uint dmrC_value_size(longlong value)

{
  uint uVar1;
  
  uVar1 = 8;
  if ((0xff < (ulong)value) && (uVar1 = 0x10, 0xffff < (ulong)value)) {
    uVar1 = (uint)((ulong)value >> 0x20 != 0) * 0x20 + 0x20;
  }
  return uVar1;
}

Assistant:

unsigned int dmrC_value_size(long long value)
{
	value >>= 8;
	if (!value)
		return 8;
	value >>= 8;
	if (!value)
		return 16;
	value >>= 16;
	if (!value)
		return 32;
	return 64;
}